

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O0

void AddDefinitionEscaped(cmMakefile *makefile,char *key,string *value)

{
  char *value_00;
  string local_78;
  allocator local_41;
  string local_40;
  string *local_20;
  string *value_local;
  char *key_local;
  cmMakefile *makefile_local;
  
  local_20 = value;
  value_local = (string *)key;
  key_local = (char *)makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,key,&local_41);
  cmOutputConverter::EscapeForCMake(&local_78,local_20);
  value_00 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(makefile,&local_40,value_00);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

static void AddDefinitionEscaped(cmMakefile* makefile, const char* key,
                                 const std::string& value)
{
  makefile->AddDefinition(key,
                          cmOutputConverter::EscapeForCMake(value).c_str());
}